

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O1

int cmFortranParser_Input(cmFortranParser *parser,char *buffer,size_t bufferSize)

{
  size_t sVar1;
  int iVar2;
  _Elt_pointer pcVar3;
  
  pcVar3 = (parser->FileStack).c.super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  iVar2 = 0;
  if (pcVar3 != (parser->FileStack).c.
                super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur) {
    if (pcVar3 == (parser->FileStack).c.
                  super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      pcVar3 = (parser->FileStack).c.
               super__Deque_base<cmFortranFile,_std::allocator<cmFortranFile>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 9;
    }
    sVar1 = fread(buffer,1,bufferSize,(FILE *)pcVar3[-1].File);
    if (sVar1 == 0) {
      if (pcVar3[-1].LastCharWasNewline == false) {
        *buffer = '\n';
        pcVar3[-1].LastCharWasNewline = true;
        iVar2 = 1;
      }
    }
    else {
      pcVar3[-1].LastCharWasNewline = buffer[sVar1 - 1] == '\n';
      iVar2 = (int)sVar1;
    }
  }
  return iVar2;
}

Assistant:

void cmFortranParser_RuleIfndef(cmFortranParser* parser, const char* macro)
{
  // A new PP branch has been opened
  parser->SkipToEnd.push(false);

  if (parser->InPPFalseBranch) {
    parser->InPPFalseBranch++;
  } else if (parser->PPDefinitions.find(macro) !=
             parser->PPDefinitions.end()) {
    parser->InPPFalseBranch = 1;
  } else {
    // ignore other branches
    parser->SkipToEnd.top() = true;
  }
}